

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
::calculate_storage_size
          (vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
           *this,size_t new_size,size_t new_elem_size,size_t new_alignment)

{
  elem_ptr_pointer pvVar1;
  elem_ptr_pointer pvVar2;
  unsigned_long uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  if (new_alignment < this->_align_max) {
    new_alignment = this->_align_max;
  }
  uVar6 = (new_elem_size + new_alignment) - 1;
  uVar3 = std::
          accumulate<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>,std::integral_constant<bool,true>>,std::allocator_traits<custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>>>const*,unsigned_long,poly::vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>,std::integral_constant<bool,true>>>::calculate_storage_size(unsigned_long,unsigned_long,unsigned_long)const::_lambda(unsigned_long,auto:1_const&)_1_>
                    ((vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>_>_>
                      *)(this->
                        super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>_>
                        )._storage,this->_free_elem,new_alignment,
                     (anon_class_8_1_44ed32e8)new_alignment);
  uVar6 = uVar6 - uVar6 % new_alignment;
  pvVar1 = (elem_ptr_pointer)
           (this->
           super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>_>
           )._storage;
  pvVar2 = this->_free_elem;
  if (pvVar1 == pvVar2) {
    uVar4 = ((long)pvVar2 - (long)pvVar1) / 0x28;
    uVar7 = uVar6;
  }
  else {
    uVar4 = ((long)pvVar2 - (long)pvVar1) / 0x28;
    uVar7 = (uVar4 + uVar3 + uVar6) / (uVar4 + 1);
  }
  lVar5 = 0;
  if (uVar4 <= new_size) {
    lVar5 = new_size - uVar4;
  }
  pVar8.first = lVar5 * uVar7 + new_size * 0x28 + uVar3 + uVar6;
  pVar8.second = new_alignment;
  return pVar8;
}

Assistant:

inline std::pair<size_t, size_t> vector<I, A, C>::calculate_storage_size(
    size_t new_size, size_t new_elem_size, size_t new_alignment) const noexcept
{
    const auto max_alignment            = std::max(new_alignment, max_align());
    const auto initial_alignment_buffer = max_alignment;
    const auto new_object_size
        = ((new_elem_size + max_alignment - 1) / max_alignment) * max_alignment;
    const auto buffer_size = std::accumulate(begin_elem(), end_elem(), initial_alignment_buffer,
        [max_alignment](size_t val, const auto& p) {
            return val + ((p.size() + max_alignment - 1) / max_alignment) * max_alignment;
        });
    auto       avg_obj_size
        = !empty() ? (buffer_size + new_object_size + size()) / (size() + 1) : new_object_size;
    auto num_of_new_obj = new_size >= size() ? (new_size - size()) : 0U;
    auto size           = new_size * sizeof(elem_ptr) + // storage for ptrs
        buffer_size + // storage for existing elems w initial alignment
        new_object_size + // storage for the new elem
        (num_of_new_obj * avg_obj_size); // estimated storage for new elems
    return std::make_pair(size, max_alignment);
}